

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *local_38;
  
  if (1 < argc) {
    uVar3 = 1;
    bVar1 = false;
    local_38 = (char *)0x0;
    do {
      __s1 = argv[uVar3];
      iVar2 = strcmp(__s1,"--dump-calls");
      if (iVar2 == 0) {
LAB_0010bd6a:
        dump_calls = 0;
        __s1 = local_38;
      }
      else {
        iVar2 = strcmp(__s1,"--no-dump-calls");
        if (iVar2 == 0) {
LAB_0010bd87:
          dump_calls = 1;
          __s1 = local_38;
        }
        else {
          iVar2 = strcmp(__s1,"--dump-callers");
          if (iVar2 == 0) {
            dump_callers = 1;
            __s1 = local_38;
          }
          else {
            iVar2 = strcmp(__s1,"--no-dump-callers");
            if (iVar2 == 0) {
              dump_callers = 0;
              __s1 = local_38;
            }
            else {
              iVar2 = strcmp(__s1,"--dump-errors");
              if (iVar2 == 0) {
                dump_errors = 1;
                __s1 = local_38;
              }
              else {
                iVar2 = strcmp(__s1,"--no-dump-errors");
                if (iVar2 == 0) {
                  dump_errors = 0;
                  __s1 = local_38;
                }
                else {
                  iVar2 = strcmp(__s1,"--dump-state-changes");
                  if (iVar2 == 0) {
                    dump_state_changes = 1;
                    __s1 = local_38;
                  }
                  else {
                    iVar2 = strcmp(__s1,"--no-dump-state-changes");
                    if (iVar2 == 0) {
                      dump_state_changes = 0;
                      __s1 = local_38;
                    }
                    else {
                      iVar2 = strcmp(__s1,"--dump-all");
                      if (iVar2 == 0) {
                        dump_state_changes = 1;
                        dump_errors = 1;
                        dump_callers = 1;
                        goto LAB_0010bd6a;
                      }
                      iVar2 = strcmp(__s1,"--no-dump-all");
                      if (iVar2 == 0) {
                        dump_state_changes = 0;
                        dump_errors = 0;
                        dump_callers = 0;
                        goto LAB_0010bd87;
                      }
                      iVar2 = strcmp(__s1,"--run");
                      if (iVar2 == 0) {
                        run_calls = '\x01';
                        __s1 = local_38;
                      }
                      else {
                        iVar2 = strcmp(__s1,"--no-run");
                        if (iVar2 == 0) {
                          run_calls = '\0';
                          __s1 = local_38;
                        }
                        else {
                          iVar2 = strcmp(__s1,"--help");
                          if (iVar2 == 0) {
                            bVar1 = true;
                            __s1 = local_38;
                          }
                          else if (local_38 != (char *)0x0) {
                            bVar1 = true;
                            __s1 = local_38;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_38 = __s1;
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
    if ((local_38 != (char *)0x0) && (!bVar1)) {
      dumping = (byte)(dump_errors | dump_callers | ~dump_calls | dump_state_changes) & 1;
      if (run_calls == '\x01') {
        iVar2 = init_clock();
        if (iVar2 == 0) {
          return 1;
        }
        iVar2 = load_real_openal();
        if (iVar2 == 0) {
          return 1;
        }
      }
      fprintf(_stderr,"\n\n\n%s: Playback OpenAL session from log file \'%s\'\n\n\n",GAppName,
              local_38);
      iVar2 = process_tracelog(local_38,(void *)0x0);
      if (run_calls != '\x01') {
        return (uint)(iVar2 == 0);
      }
      close_real_openal();
      return (uint)(iVar2 == 0);
    }
  }
  main_cold_1();
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    const char *fname = NULL;
    int retval = 0;
    int usage = 0;
    int i;

    for (i = 1; i < argc; i++) {
        const char *arg = argv[i];
        if (strcmp(arg, "--dump-calls") == 0) {
            dump_calls = 1;
        } else if (strcmp(arg, "--no-dump-calls") == 0) {
            dump_calls = 0;
        } else if (strcmp(arg, "--dump-callers") == 0) {
            dump_callers = 1;
        } else if (strcmp(arg, "--no-dump-callers") == 0) {
            dump_callers = 0;
        } else if (strcmp(arg, "--dump-errors") == 0) {
            dump_errors = 1;
        } else if (strcmp(arg, "--no-dump-errors") == 0) {
            dump_errors = 0;
        } else if (strcmp(arg, "--dump-state-changes") == 0) {
            dump_state_changes = 1;
        } else if (strcmp(arg, "--no-dump-state-changes") == 0) {
            dump_state_changes = 0;
        } else if (strcmp(arg, "--dump-all") == 0) {
            dump_calls = dump_callers = dump_errors = dump_state_changes = 1;
        } else if (strcmp(arg, "--no-dump-all") == 0) {
            dump_calls = dump_callers = dump_errors = dump_state_changes = 0;
        } else if (strcmp(arg, "--run") == 0) {
            run_calls = 1;
        } else if (strcmp(arg, "--no-run") == 0) {
            run_calls = 0;
        } else if (strcmp(arg, "--help") == 0) {
            usage = 1;
        } else if (fname == NULL) {
            fname = arg;
        } else {
            usage = 1;
        }
    }

    if (fname == NULL) {
        usage = 1;
    }

    if (usage) {
        fprintf(stderr, "USAGE: %s [args] <altrace.trace>\n", argv[0]);
        fprintf(stderr, "  args:\n");
        fprintf(stderr, "   --[no-]dump-calls\n");
        fprintf(stderr, "   --[no-]dump-callers\n");
        fprintf(stderr, "   --[no-]dump-errors\n");
        fprintf(stderr, "   --[no-]dump-state-changes\n");
        fprintf(stderr, "   --[no-]dump-all\n");
        fprintf(stderr, "   --[no-]run\n");
        fprintf(stderr, "\n");
        return 1;
    }

    dumping = dump_calls || dump_callers || dump_errors || dump_state_changes;

    if (run_calls) {
        if (!init_clock()) {
            return 1;
        }

        if (!load_real_openal()) {
            return 1;
        }
    }

    fprintf(stderr, "\n\n\n%s: Playback OpenAL session from log file '%s'\n\n\n", GAppName, fname);

    if (!process_tracelog(fname, NULL)) {
        retval = 1;
    }

    if (run_calls) {
        close_real_openal();
    }

    return retval;
}